

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_c_zpbeint.c
# Opt level: O2

void gga_c_zpbeint_init(xc_func_type *p)

{
  int iVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  puVar2 = (undefined4 *)malloc(0x10);
  p->params = puVar2;
  iVar1 = p->info->number;
  if (iVar1 == 0x3d) {
    uVar3 = 0x76c8b439;
    uVar4 = 0x3faa9fbe;
    uVar5 = 0x40033333;
  }
  else {
    if (iVar1 != 0x3f) {
      fwrite("Internal error in gga_c_zpbeint\n",0x20,1,_stderr);
      exit(1);
    }
    uVar3 = 0xdf3b645a;
    uVar4 = 0x3fa78d4f;
    uVar5 = 0x40133333;
  }
  *puVar2 = uVar3;
  puVar2[1] = uVar4;
  puVar2[2] = 0x33333333;
  puVar2[3] = uVar5;
  return;
}

Assistant:

static void
gga_c_zpbeint_init(xc_func_type *p)
{
  gga_c_zpbeint_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_c_zpbeint_params));
  params = (gga_c_zpbeint_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_C_ZPBEINT:
    params->beta  = 0.052;
    params->alpha = 2.4;
    break;
  case XC_GGA_C_ZPBESOL:
    params->beta  = 0.046;
    params->alpha = 4.8;
    break;
  default:
    fprintf(stderr, "Internal error in gga_c_zpbeint\n");
    exit(1);
  }
}